

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Mix_1in_8out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  uint32_t i;
  float *coefficients_local;
  float *dst_local;
  float *src_local;
  uint32_t UNUSED2_local;
  uint32_t UNUSED1_local;
  uint32_t toMix_local;
  
  dst_local = dst;
  src_local = src;
  for (i = 0; i < toMix; i = i + 1) {
    *dst_local = *src_local * *coefficients + *dst_local;
    dst_local[1] = *src_local * coefficients[1] + dst_local[1];
    dst_local[2] = *src_local * coefficients[2] + dst_local[2];
    dst_local[3] = *src_local * coefficients[3] + dst_local[3];
    dst_local[4] = *src_local * coefficients[4] + dst_local[4];
    dst_local[5] = *src_local * coefficients[5] + dst_local[5];
    dst_local[6] = *src_local * coefficients[6] + dst_local[6];
    dst_local[7] = *src_local * coefficients[7] + dst_local[7];
    src_local = src_local + 1;
    dst_local = dst_local + 8;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_8out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 1, dst += 8)
	{
		dst[0] += src[0] * coefficients[0];
		dst[1] += src[0] * coefficients[1];
		dst[2] += src[0] * coefficients[2];
		dst[3] += src[0] * coefficients[3];
		dst[4] += src[0] * coefficients[4];
		dst[5] += src[0] * coefficients[5];
		dst[6] += src[0] * coefficients[6];
		dst[7] += src[0] * coefficients[7];
	}
}